

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTaskScheduler.cpp
# Opt level: O3

void __thiscall
JobQueue::setupJobStealing
          (JobQueue *this,cbtAlignedObjectArray<JobQueue> *contextArray,int numActiveContexts)

{
  JobQueue **ppJVar1;
  uint uVar2;
  JobQueue **ppJVar3;
  long lVar4;
  uint uVar5;
  JobQueue *pJVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  int i;
  
  iVar9 = contextArray->m_size;
  if (0 < (long)iVar9) {
    pJVar6 = contextArray->m_data + -1;
    lVar12 = 0;
    do {
      pJVar6 = pJVar6 + 1;
      if (pJVar6 == this) goto LAB_008f5413;
      lVar12 = lVar12 + 1;
    } while (iVar9 != lVar12);
  }
  lVar12 = 0;
LAB_008f5413:
  iVar10 = 3;
  if (iVar9 < 3) {
    iVar10 = iVar9;
  }
  uVar2 = (this->m_neighborContexts).m_capacity;
  uVar11 = iVar10 - 1;
  if ((int)uVar2 < (int)uVar11) {
    if (uVar11 == 0) {
      ppJVar3 = (JobQueue **)0x0;
    }
    else {
      ppJVar3 = (JobQueue **)cbtAlignedAllocInternal((long)(int)uVar11 << 3,0x10);
    }
    lVar4 = (long)(this->m_neighborContexts).m_size;
    if (0 < lVar4) {
      lVar7 = 0;
      do {
        ppJVar3[lVar7] = (this->m_neighborContexts).m_data[lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar4 != lVar7);
    }
    ppJVar1 = (this->m_neighborContexts).m_data;
    if ((ppJVar1 != (JobQueue **)0x0) && ((this->m_neighborContexts).m_ownsMemory == true)) {
      cbtAlignedFreeInternal(ppJVar1);
    }
    (this->m_neighborContexts).m_ownsMemory = true;
    (this->m_neighborContexts).m_data = ppJVar3;
    (this->m_neighborContexts).m_capacity = uVar11;
    uVar2 = uVar11;
  }
  if ((int)((this->m_neighborContexts).m_size & uVar2) < 0) {
    ppJVar3 = (this->m_neighborContexts).m_data;
    if ((ppJVar3 != (JobQueue **)0x0) && ((this->m_neighborContexts).m_ownsMemory == true)) {
      cbtAlignedFreeInternal(ppJVar3);
    }
    (this->m_neighborContexts).m_ownsMemory = true;
    (this->m_neighborContexts).m_data = (JobQueue **)0x0;
    (this->m_neighborContexts).m_capacity = 0;
  }
  (this->m_neighborContexts).m_size = 0;
  uVar2 = 0;
  lVar4 = 0;
  do {
    if ((int)uVar11 <= (int)uVar2) {
      return;
    }
    uVar5 = (&DAT_009f0940)[lVar4] + (int)lVar12;
    if ((int)uVar5 < numActiveContexts && -1 < (int)uVar5) {
      pJVar6 = contextArray->m_data;
      if (uVar2 == (this->m_neighborContexts).m_capacity) {
        iVar9 = uVar2 * 2;
        if (uVar2 == 0) {
          iVar9 = 1;
        }
        if ((int)uVar2 < iVar9) {
          if (iVar9 == 0) {
            ppJVar3 = (JobQueue **)0x0;
          }
          else {
            ppJVar3 = (JobQueue **)cbtAlignedAllocInternal((long)iVar9 << 3,0x10);
            uVar2 = (this->m_neighborContexts).m_size;
          }
          if (0 < (int)uVar2) {
            uVar8 = 0;
            do {
              ppJVar3[uVar8] = (this->m_neighborContexts).m_data[uVar8];
              uVar8 = uVar8 + 1;
            } while (uVar2 != uVar8);
          }
          ppJVar1 = (this->m_neighborContexts).m_data;
          if ((ppJVar1 != (JobQueue **)0x0) && ((this->m_neighborContexts).m_ownsMemory == true)) {
            cbtAlignedFreeInternal(ppJVar1);
            uVar2 = (this->m_neighborContexts).m_size;
          }
          (this->m_neighborContexts).m_ownsMemory = true;
          (this->m_neighborContexts).m_data = ppJVar3;
          (this->m_neighborContexts).m_capacity = iVar9;
        }
      }
      (this->m_neighborContexts).m_data[(int)uVar2] = pJVar6 + uVar5;
      uVar2 = uVar2 + 1;
      (this->m_neighborContexts).m_size = uVar2;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  return;
}

Assistant:

void setupJobStealing(cbtAlignedObjectArray<JobQueue> * contextArray, int numActiveContexts)
	{
		cbtAlignedObjectArray<JobQueue>& contexts = *contextArray;
		int selfIndex = 0;
		for (int i = 0; i < contexts.size(); ++i)
		{
			if (this == &contexts[i])
			{
				selfIndex = i;
				break;
			}
		}
		int numNeighbors = cbtMin(2, contexts.size() - 1);
		int neighborOffsets[] = {-1, 1, -2, 2, -3, 3};
		int numOffsets = sizeof(neighborOffsets) / sizeof(neighborOffsets[0]);
		m_neighborContexts.reserve(numNeighbors);
		m_neighborContexts.resizeNoInitialize(0);
		for (int i = 0; i < numOffsets && m_neighborContexts.size() < numNeighbors; i++)
		{
			int neighborIndex = selfIndex + neighborOffsets[i];
			if (neighborIndex >= 0 && neighborIndex < numActiveContexts)
			{
				m_neighborContexts.push_back(&contexts[neighborIndex]);
			}
		}
	}